

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O2

void __thiscall QtMWidgets::SwitchPrivate::setState(SwitchPrivate *this,State st)

{
  QStyleOption opt;
  QRect local_40 [3];
  
  if (this->state != st) {
    this->state = st;
    QStyleOption::QStyleOption(&opt,1,0);
    QStyleOption::initFrom((QWidget *)&opt);
    initOffset(this,local_40);
    emitSignals(this);
    QWidget::update();
    QStyleOption::~QStyleOption(&opt);
  }
  return;
}

Assistant:

void
SwitchPrivate::setState( Switch::State st )
{
	if( state != st )
	{
		state = st;

		QStyleOption opt;
		opt.initFrom( q );

		initOffset( opt.rect );

		emitSignals();

		q->update();
	}
}